

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

void __thiscall FDecalLib::ParseFader(FDecalLib *this,FScanner *sc)

{
  bool bVar1;
  FDecalFaderAnim *this_00;
  int iVar2;
  int local_44;
  FString faderName;
  FDecalFaderAnim *local_38;
  
  faderName.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  FString::operator=(&faderName,sc->String);
  FScanner::MustGetStringName(sc,"{");
  local_44 = 0;
  iVar2 = 0;
  while( true ) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"}");
    if (bVar1) break;
    bVar1 = FScanner::Compare(sc,"DecayStart");
    if (bVar1) {
      FScanner::MustGetFloat(sc);
      iVar2 = (int)(sc->Float * 35.0);
    }
    else {
      bVar1 = FScanner::Compare(sc,"DecayTime");
      if (bVar1) {
        FScanner::MustGetFloat(sc);
        local_44 = (int)(sc->Float * 35.0);
      }
      else {
        FScanner::ScriptError(sc,"Unknown fader parameter \'%s\'",sc->String);
      }
    }
  }
  this_00 = (FDecalFaderAnim *)operator_new(0x18);
  FDecalFaderAnim::FDecalFaderAnim(this_00,faderName.Chars);
  *(int *)&(this_00->super_FDecalAnimator).field_0xc = iVar2;
  this_00->DecayTime = local_44;
  local_38 = this_00;
  TArray<FDecalAnimator_*,_FDecalAnimator_*>::Push
            (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,
             (FDecalAnimator **)&local_38);
  FString::~FString(&faderName);
  return;
}

Assistant:

void FDecalLib::ParseFader (FScanner &sc)
{
	FString faderName;
	int startTime = 0, decayTime = 0;

	sc.MustGetString ();
	faderName = sc.String;
	sc.MustGetStringName ("{");
	
	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			FDecalFaderAnim *fader = new FDecalFaderAnim (faderName);
			fader->DecayStart = startTime;
			fader->DecayTime = decayTime;
			Animators.Push (fader);
			break;
		}
		else if (sc.Compare ("DecayStart"))
		{
			sc.MustGetFloat ();
			startTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("DecayTime"))
		{
			sc.MustGetFloat ();
			decayTime = (int)(sc.Float * TICRATE);
		}
		else
		{
			sc.ScriptError ("Unknown fader parameter '%s'", sc.String);
		}
	}
}